

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var-type.hpp
# Opt level: O3

Options * __thiscall
yactfr::VariantWithIntegerSelectorType<unsigned_long_long>::_cloneOpts
          (Options *__return_storage_ptr__,VariantWithIntegerSelectorType<unsigned_long_long> *this)

{
  pointer puVar1;
  _Tuple_impl<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
  in_RAX;
  int in_ECX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  pointer *__ptr;
  void *in_R8;
  pointer puVar2;
  _Head_base<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_false> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (this->_opts).
           super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = in_RAX.
             super__Head_base<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_false>.
             _M_head_impl;
  for (puVar2 = (this->_opts).
                super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    VariantTypeOption<unsigned_long_long>::clone
              ((VariantTypeOption<unsigned_long_long> *)&stack0xffffffffffffffd8,
               (__fn *)(puVar2->_M_t).
                       super___uniq_ptr_impl<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                       .
                       super__Head_base<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_false>
                       ._M_head_impl,in_RDX,in_ECX,in_R8);
    std::
    vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
    ::
    emplace_back<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>
              ((vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
                *)__return_storage_ptr__,
               (unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                *)&stack0xffffffffffffffd8);
    in_RDX = extraout_RDX;
    if (local_28._M_head_impl != (VariantTypeOption<unsigned_long_long> *)0x0) {
      std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>::operator()
                ((default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_> *)
                 &stack0xffffffffffffffd8,local_28._M_head_impl);
      in_RDX = extraout_RDX_00;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Options _cloneOpts() const
    {
        Options opts;

        for (const auto& opt : _opts) {
            opts.push_back(opt->clone());
        }

        return opts;
    }